

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_split_lastCharDelimiter_fn(int _i)

{
  int iVar1;
  ASplittedString *splitted;
  char *pcVar2;
  char *pcVar3;
  char *expr;
  char **ppcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x15161e;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"0123456;",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x15165e;
  splitted = AString_split(&string,';',false);
  if (string.capacity != 8) {
    local_60 = "(8)";
    pcVar6 = "(string).capacity == (8)";
    pcVar7 = "(string).capacity";
    pcVar2 = (char *)string.capacity;
LAB_00151a46:
    iVar1 = 0xa19;
LAB_00151dd4:
    local_58 = (char *)0x8;
LAB_00151dda:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar5 = &local_60;
    goto LAB_00151ddc;
  }
  uStack_50 = 0x15167f;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0xa19);
  if (string.buffer == (char *)0x0) {
    ppcVar4 = &local_58;
    pcVar7 = "Assertion \'_ck_x != NULL\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %#x";
    pcVar6 = "(void*) (string).buffer != NULL";
    pcVar8 = "(void*) (string).buffer";
    iVar1 = 0xa19;
    goto LAB_00151d40;
  }
  uStack_50 = 0x15169c;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0xa19);
  pcVar8 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar2 = "";
    pcVar8 = "(null)";
LAB_001519da:
    local_60 = "0123456;";
    pcStack_70 = "(\"0123456;\")";
    pcVar6 = "(string).buffer == (\"0123456;\")";
    pcVar7 = "(void*) (string).buffer";
    iVar1 = 0xa19;
  }
  else {
    uStack_50 = 0x1516bc;
    iVar1 = strcmp("0123456;",string.buffer);
    if (iVar1 != 0) {
      pcVar2 = "\"";
      goto LAB_001519da;
    }
    uStack_50 = 0x1516d5;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa19);
    if (string.size != 8) {
      local_60 = "strlen(\"0123456;\")";
      pcVar6 = "(string).size == strlen(\"0123456;\")";
      pcVar7 = "(string).size";
      pcVar2 = (char *)string.size;
      goto LAB_00151a46;
    }
    uStack_50 = 0x1516f5;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa19);
    if (splitted == (ASplittedString *)0x0) {
      ppcVar4 = &local_58;
      pcVar7 = "Assertion \'_ck_x != NULL\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %#x";
      pcVar6 = "(void*) splitted != NULL";
      pcVar8 = "(void*) splitted";
      iVar1 = 0xa1a;
      goto LAB_00151d40;
    }
    uStack_50 = 0x15170f;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa1a);
    uStack_50 = 0x151717;
    pcVar2 = (char *)private_ACUtils_ADynArray_size(splitted);
    if (pcVar2 != (char *)0x2) {
      local_60 = "2";
      pcVar6 = "private_ACUtils_ADynArray_size(splitted) == 2";
      pcVar7 = "private_ACUtils_ADynArray_size(splitted)";
      iVar1 = 0xa1b;
      local_58 = (char *)0x2;
      goto LAB_00151dda;
    }
    uStack_50 = 0x151732;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa1b);
    pcVar2 = (char *)(*splitted->buffer)->capacity;
    if (pcVar2 != (char *)0x8) {
      local_60 = "(8)";
      pcVar6 = "(*(splitted->buffer[0])).capacity == (8)";
      pcVar7 = "(*(splitted->buffer[0])).capacity";
      iVar1 = 0xa1c;
      goto LAB_00151dd4;
    }
    uStack_50 = 0x151758;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa1c);
    if ((*splitted->buffer)->buffer == (char *)0x0) {
      ppcVar4 = &local_58;
      pcVar7 = "Assertion \'_ck_x != NULL\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %#x";
      pcVar6 = "(void*) (*(splitted->buffer[0])).buffer != NULL";
      pcVar8 = "(void*) (*(splitted->buffer[0])).buffer";
      iVar1 = 0xa1c;
      goto LAB_00151d40;
    }
    uStack_50 = 0x15177b;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa1c);
    pcVar8 = (*splitted->buffer)->buffer;
    if (pcVar8 == (char *)0x0) {
      pcVar2 = "";
      pcVar8 = "(null)";
    }
    else {
      uStack_50 = 0x15179e;
      iVar1 = strcmp("0123456",pcVar8);
      if (iVar1 == 0) {
        uStack_50 = 0x1517b7;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0xa1c);
        pcVar2 = (char *)(*splitted->buffer)->size;
        if (pcVar2 != (char *)0x7) {
          local_60 = "strlen(\"0123456\")";
          pcVar6 = "(*(splitted->buffer[0])).size == strlen(\"0123456\")";
          pcVar7 = "(*(splitted->buffer[0])).size";
          iVar1 = 0xa1c;
          local_58 = (char *)0x7;
          goto LAB_00151dda;
        }
        uStack_50 = 0x1517dd;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0xa1c);
        pcVar2 = (char *)splitted->buffer[1]->capacity;
        if (pcVar2 != (char *)0x8) {
          local_60 = "(8)";
          pcVar6 = "(*(splitted->buffer[1])).capacity == (8)";
          pcVar7 = "(*(splitted->buffer[1])).capacity";
          iVar1 = 0xa1d;
          goto LAB_00151dd4;
        }
        uStack_50 = 0x151804;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0xa1d);
        if (splitted->buffer[1]->buffer == (char *)0x0) {
          ppcVar4 = &local_58;
          pcVar7 = "Assertion \'_ck_x != NULL\' failed";
          pcVar2 = "Assertion \'%s\' failed: %s == %#x";
          pcVar6 = "(void*) (*(splitted->buffer[1])).buffer != NULL";
          pcVar8 = "(void*) (*(splitted->buffer[1])).buffer";
        }
        else {
          uStack_50 = 0x151828;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa1d);
          pcVar2 = splitted->buffer[1]->buffer;
          if (pcVar2 == (char *)0x0) {
            pcVar2 = "(null)";
            pcStack_78 = "";
LAB_00151c4d:
            uStack_50 = 0;
            local_58 = "\"";
            local_60 = "";
            local_68 = "\"";
            pcStack_70 = "(\"\")";
            pcStack_80 = pcVar2;
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0xa1d,
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                              "(*(splitted->buffer[1])).buffer == (\"\")",
                              "(*(splitted->buffer[1])).buffer",pcStack_78);
          }
          if (*pcVar2 != '\0') {
            pcStack_78 = "\"";
            goto LAB_00151c4d;
          }
          uStack_50 = 0x15185f;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa1d);
          pcVar3 = (char *)splitted->buffer[1]->size;
          if (pcVar3 == (char *)0x0) {
            uStack_50 = 0x151885;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa1d);
            uStack_50 = 0x15188d;
            AString_freeSplitted(splitted);
            if (string.capacity == 8) {
              uStack_50 = 0x1518ad;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa1f);
              if (string.buffer == (char *)0x0) {
                ppcVar4 = &local_58;
                pcVar7 = "Assertion \'_ck_x != NULL\' failed";
                pcVar2 = "Assertion \'%s\' failed: %s == %#x";
                pcVar6 = "(void*) (string).buffer != NULL";
                pcVar8 = "(void*) (string).buffer";
                iVar1 = 0xa1f;
                goto LAB_00151d40;
              }
              uStack_50 = 0x1518ca;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa1f);
              pcVar8 = string.buffer;
              if (string.buffer == (char *)0x0) {
                pcVar8 = "(null)";
                pcVar2 = "";
              }
              else {
                uStack_50 = 0x1518e7;
                iVar1 = strcmp("0123456;",string.buffer);
                if (iVar1 == 0) {
                  uStack_50 = 0x151900;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0xa1f);
                  if (string.size == 8) {
                    uStack_50 = 0x151920;
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa1f);
                    local_58 = (char *)private_ACUtilsTest_AString_freeCount;
                    if (private_ACUtilsTest_AString_reallocCount ==
                        private_ACUtilsTest_AString_freeCount) {
                      uStack_50 = 0x151948;
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0xa20);
                      uStack_50 = 0x151951;
                      (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))
                                (string.buffer);
                      return;
                    }
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar6 = 
                    "private_ACUtilsTest_AString_reallocCount == (private_ACUtilsTest_AString_freeCount)"
                    ;
                    pcVar7 = "private_ACUtilsTest_AString_reallocCount";
                    iVar1 = 0xa20;
                    ppcVar5 = &local_60;
                    local_60 = "(private_ACUtilsTest_AString_freeCount)";
                    pcVar2 = (char *)private_ACUtilsTest_AString_reallocCount;
                    goto LAB_00151ddc;
                  }
                  local_60 = "strlen(\"0123456;\")";
                  pcVar6 = "(string).size == strlen(\"0123456;\")";
                  pcVar7 = "(string).size";
                  pcVar2 = (char *)string.size;
                  goto LAB_00151dcf;
                }
                pcVar2 = "\"";
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar6 = "(string).buffer == (\"0123456;\")";
              pcVar7 = "(string).buffer";
              iVar1 = 0xa1f;
              local_58 = "\"";
              local_60 = "0123456;";
              local_68 = "\"";
              pcStack_70 = "(\"0123456;\")";
              ppcVar5 = &pcStack_80;
              pcStack_80 = pcVar8;
              pcStack_78 = pcVar2;
              goto LAB_00151ddc;
            }
            local_60 = "(8)";
            pcVar6 = "(string).capacity == (8)";
            pcVar7 = "(string).capacity";
            pcVar2 = (char *)string.capacity;
LAB_00151dcf:
            iVar1 = 0xa1f;
            goto LAB_00151dd4;
          }
          ppcVar4 = &local_68;
          local_60 = "strlen(\"\")";
          pcVar7 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar6 = "(*(splitted->buffer[1])).size == strlen(\"\")";
          pcVar8 = "(*(splitted->buffer[1])).size";
          local_68 = pcVar3;
        }
        iVar1 = 0xa1d;
LAB_00151d40:
        uStack_50 = 0;
        local_58 = (char *)0x0;
        *(undefined8 *)((long)ppcVar4 + -8) = 0x151d47;
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,iVar1,pcVar7,pcVar2,pcVar6,pcVar8);
      }
      pcVar2 = "\"";
    }
    local_60 = "0123456";
    pcStack_70 = "(\"0123456\")";
    pcVar6 = "(*(splitted->buffer[0])).buffer == (\"0123456\")";
    pcVar7 = "(void*) (*(splitted->buffer[0])).buffer";
    iVar1 = 0xa1c;
  }
  pcVar7 = pcVar7 + 8;
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  local_68 = "\"";
  ppcVar5 = &pcStack_80;
  pcStack_80 = pcVar8;
  pcStack_78 = pcVar2;
LAB_00151ddc:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar2;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x151de3;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_split_lastCharDelimiter)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("0123456;", 8);
    struct ASplittedString *splitted;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    splitted = AString_split(&string, ';', false);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "0123456;", 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(splitted);
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_size(splitted), 2);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 0), "0123456", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 1), "", 8);
    AString_freeSplitted(splitted);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "0123456;", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(private_ACUtilsTest_AString_freeCount);
    private_ACUtilsTest_AString_destructTestString(string);
}